

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::EraseUseRecordsOfOperandIds
          (DefUseManager *this,Instruction *inst)

{
  bool bVar1;
  pointer ppVar2;
  reference puVar3;
  key_type local_58;
  uint32_t local_44;
  iterator iStack_40;
  uint use_id;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  _Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  local_20;
  iterator iter;
  Instruction *inst_local;
  DefUseManager *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
               )inst;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->inst_to_used_ids_,(key_type *)&iter);
  __range3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::end(&this->inst_to_used_ids_);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                      *)&__range3);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
                           *)&local_20);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&ppVar2->second);
    iStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&ppVar2->second);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc0), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      local_44 = *puVar3;
      local_58.def = GetDef(this,local_44);
      local_58.user =
           (Instruction *)
           iter.
           super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
           ._M_cur;
      std::
      set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
      ::erase(&this->id_to_users_,&local_58);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end3);
    }
    std::
    unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::erase(&this->inst_to_used_ids_,(iterator)local_20._M_cur);
  }
  return;
}

Assistant:

void DefUseManager::EraseUseRecordsOfOperandIds(const Instruction* inst) {
  // Go through all ids used by this instruction, remove this instruction's
  // uses of them.
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    for (auto use_id : iter->second) {
      id_to_users_.erase(
          UserEntry{GetDef(use_id), const_cast<Instruction*>(inst)});
    }
    inst_to_used_ids_.erase(iter);
  }
}